

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O2

void __thiscall
Assimp::ObjFileMtlImporter::getTextureOption
          (ObjFileMtlImporter *this,bool *clamp,int *clampIndex,aiString **out)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  long lVar5;
  bool bVar6;
  char value_1 [3];
  char value [12];
  
  _Var4 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var4._M_current;
  do {
    pcVar1 = (this->m_DataItEnd)._M_current;
    if (((_Var4._M_current == pcVar1) || (pcVar1 + -1 == _Var4._M_current)) ||
       (*_Var4._M_current != '-')) {
      return;
    }
    iVar2 = ASSIMP_strincmp(_Var4._M_current,ClampOption_abi_cxx11_,DAT_007f5d70);
    if (iVar2 == 0) {
      _Var4 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
      CopyNextWord<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                (_Var4,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                       (this->m_DataItEnd)._M_current,value_1,3);
      iVar2 = strncasecmp(value_1,"on",2);
      if (iVar2 == 0) {
        *clamp = true;
      }
LAB_00576f9f:
      iVar2 = 2;
    }
    else {
      iVar2 = ASSIMP_strincmp(_Var4._M_current,TypeOption_abi_cxx11_,DAT_007f5dd0);
      if (iVar2 == 0) {
        _Var4 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                          ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
        CopyNextWord<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  (_Var4,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                         (this->m_DataItEnd)._M_current,value,0xc);
        iVar2 = strncasecmp(value,"cube_top",8);
        lVar5 = 0x1c1c;
        if (iVar2 == 0) {
          iVar2 = 7;
        }
        else {
          iVar2 = strncasecmp(value,"cube_bottom",0xb);
          if (iVar2 == 0) {
            lVar5 = 0x2020;
            iVar2 = 8;
          }
          else {
            iVar2 = strncasecmp(value,"cube_front",10);
            if (iVar2 == 0) {
              lVar5 = 0x2424;
              iVar2 = 9;
            }
            else {
              iVar2 = strncasecmp(value,"cube_back",9);
              if (iVar2 == 0) {
                lVar5 = 0x2828;
                iVar2 = 10;
              }
              else {
                iVar2 = strncasecmp(value,"cube_left",9);
                if (iVar2 == 0) {
                  lVar5 = 0x2c2c;
                  iVar2 = 0xb;
                }
                else {
                  iVar2 = strncasecmp(value,"cube_right",10);
                  if (iVar2 == 0) {
                    lVar5 = 0x3030;
                    iVar2 = 0xc;
                  }
                  else {
                    iVar3 = strncasecmp(value,"sphere",6);
                    iVar2 = 6;
                    if (iVar3 != 0) goto LAB_00576f9f;
                  }
                }
              }
            }
          }
        }
        *clampIndex = iVar2;
        *out = (aiString *)((this->m_pModel->m_pCurrentMaterial->MaterialName).data + lVar5 + -4);
        goto LAB_00576f9f;
      }
      iVar3 = ASSIMP_strincmp(_Var4._M_current,BlendUOption_abi_cxx11_,DAT_007f5c70);
      iVar2 = 2;
      if (iVar3 != 0) {
        iVar3 = ASSIMP_strincmp(_Var4._M_current,BlendVOption_abi_cxx11_,DAT_007f5c90);
        iVar2 = 2;
        if (iVar3 != 0) {
          iVar3 = ASSIMP_strincmp(_Var4._M_current,BoostOption_abi_cxx11_,DAT_007f5cb0);
          iVar2 = 2;
          if (iVar3 != 0) {
            iVar3 = ASSIMP_strincmp(_Var4._M_current,ResolutionOption_abi_cxx11_,DAT_007f5d50);
            iVar2 = 2;
            if (iVar3 != 0) {
              iVar3 = ASSIMP_strincmp(_Var4._M_current,BumpOption_abi_cxx11_,DAT_007f5d90);
              iVar2 = 2;
              if (iVar3 != 0) {
                iVar3 = ASSIMP_strincmp(_Var4._M_current,ChannelOption_abi_cxx11_,DAT_007f5db0);
                iVar2 = 2;
                if (iVar3 != 0) {
                  iVar3 = ASSIMP_strincmp(_Var4._M_current,ModifyMapOption_abi_cxx11_,DAT_007f5cd0);
                  iVar2 = 3;
                  if (iVar3 != 0) {
                    iVar2 = ASSIMP_strincmp(_Var4._M_current,OffsetOption_abi_cxx11_,DAT_007f5cf0);
                    if ((iVar2 != 0) &&
                       (iVar2 = ASSIMP_strincmp(_Var4._M_current,ScaleOption_abi_cxx11_,DAT_007f5d10
                                               ), iVar2 != 0)) {
                      iVar3 = ASSIMP_strincmp(_Var4._M_current,TurbulenceOption_abi_cxx11_,
                                              DAT_007f5d30);
                      iVar2 = 1;
                      if (iVar3 != 0) goto LAB_00576fb6;
                    }
                    iVar2 = 4;
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00576fb6:
    while( true ) {
      _Var4._M_current = (this->m_DataIt)._M_current;
      bVar6 = iVar2 == 0;
      iVar2 = iVar2 + -1;
      if (bVar6) break;
      _Var4 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        (_Var4,(this->m_DataItEnd)._M_current);
      (this->m_DataIt)._M_current = _Var4._M_current;
    }
  } while( true );
}

Assistant:

void ObjFileMtlImporter::getTextureOption(bool &clamp, int &clampIndex, aiString *&out) {
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);

    // If there is any more texture option
    while (!isEndOfBuffer(m_DataIt, m_DataItEnd) && *m_DataIt == '-')
    {
        const char *pPtr( &(*m_DataIt) );
        //skip option key and value
        int skipToken = 1;

        if (!ASSIMP_strincmp(pPtr, ClampOption.c_str(), static_cast<unsigned int>(ClampOption.size())))
        {
            DataArrayIt it = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
            char value[3];
            CopyNextWord(it, m_DataItEnd, value, sizeof(value) / sizeof(*value));
            if (!ASSIMP_strincmp(value, "on", 2))
            {
                clamp = true;
            }

            skipToken = 2;
        }
        else if( !ASSIMP_strincmp( pPtr, TypeOption.c_str(), static_cast<unsigned int>(TypeOption.size()) ) )
        {
            DataArrayIt it = getNextToken<DataArrayIt>( m_DataIt, m_DataItEnd );
            char value[ 12 ];
            CopyNextWord( it, m_DataItEnd, value, sizeof( value ) / sizeof( *value ) );
            if( !ASSIMP_strincmp( value, "cube_top", 8 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeTopType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[0];
            }
            else if( !ASSIMP_strincmp( value, "cube_bottom", 11 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeBottomType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[1];
            }
            else if( !ASSIMP_strincmp( value, "cube_front", 10 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeFrontType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[2];
            }
            else if( !ASSIMP_strincmp( value, "cube_back", 9 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeBackType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[3];
            }
            else if( !ASSIMP_strincmp( value, "cube_left", 9 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeLeftType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[4];
            }
            else if( !ASSIMP_strincmp( value, "cube_right", 10 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeRightType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[5];
            }
            else if( !ASSIMP_strincmp( value, "sphere", 6 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionSphereType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[0];
            }

            skipToken = 2;
        }
        else if (!ASSIMP_strincmp(pPtr, BlendUOption.c_str(), static_cast<unsigned int>(BlendUOption.size()))
                || !ASSIMP_strincmp(pPtr, BlendVOption.c_str(), static_cast<unsigned int>(BlendVOption.size()))
                || !ASSIMP_strincmp(pPtr, BoostOption.c_str(), static_cast<unsigned int>(BoostOption.size()))
                || !ASSIMP_strincmp(pPtr, ResolutionOption.c_str(), static_cast<unsigned int>(ResolutionOption.size()))
                || !ASSIMP_strincmp(pPtr, BumpOption.c_str(), static_cast<unsigned int>(BumpOption.size()))
                || !ASSIMP_strincmp(pPtr, ChannelOption.c_str(), static_cast<unsigned int>(ChannelOption.size())))
        {
            skipToken = 2;
        }
        else if (!ASSIMP_strincmp(pPtr, ModifyMapOption.c_str(), static_cast<unsigned int>(ModifyMapOption.size())))
        {
            skipToken = 3;
        }
        else if (  !ASSIMP_strincmp(pPtr, OffsetOption.c_str(), static_cast<unsigned int>(OffsetOption.size()))
                || !ASSIMP_strincmp(pPtr, ScaleOption.c_str(), static_cast<unsigned int>(ScaleOption.size()))
                || !ASSIMP_strincmp(pPtr, TurbulenceOption.c_str(), static_cast<unsigned int>(TurbulenceOption.size()))
                )
        {
            skipToken = 4;
        }

        for (int i = 0; i < skipToken; ++i)
        {
            m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
        }
    }
}